

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

uint __thiscall
lzham::symbol_codec::decode(symbol_codec *this,quasi_adaptive_huffman_data_model *model)

{
  uint *puVar1;
  unsigned_short *puVar2;
  int iVar3;
  decoder_tables *pdVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  byte *pbVar11;
  
  pdVar4 = (model->super_raw_quasi_adaptive_huffman_data_model).m_pDecode_tables;
  iVar10 = this->m_bit_count;
  if (iVar10 < 0x38) {
    do {
      pbVar11 = this->m_pDecode_buf_next;
      if (pbVar11 == this->m_pDecode_buf_end) {
        if (this->m_decode_buf_eof == false) {
          (*this->m_pDecode_need_bytes_func)
                    ((long)pbVar11 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                     &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
          pbVar11 = this->m_pDecode_buf;
          this->m_pDecode_buf_end = pbVar11 + this->m_decode_buf_size;
          this->m_pDecode_buf_next = pbVar11;
          if (0 < (long)this->m_decode_buf_size) goto LAB_0011f8f1;
        }
        uVar5 = 0;
      }
      else {
LAB_0011f8f1:
        this->m_pDecode_buf_next = pbVar11 + 1;
        uVar5 = (ulong)*pbVar11;
      }
      iVar3 = this->m_bit_count;
      iVar10 = iVar3 + 8;
      this->m_bit_count = iVar10;
      this->m_bit_buf = this->m_bit_buf | uVar5 << (0x38U - (char)iVar3 & 0x3f);
    } while (iVar10 < 0x38);
  }
  uVar5 = this->m_bit_buf;
  uVar7 = (uint)(ushort)(uVar5 >> 0x30);
  if (uVar7 < pdVar4->m_table_max_code) {
    uVar9 = pdVar4->m_lookup[uVar5 >> (-(char)pdVar4->m_table_bits & 0x3fU)] & 0xffff;
    uVar7 = pdVar4->m_lookup[uVar5 >> (-(char)pdVar4->m_table_bits & 0x3fU)] >> 0x10;
  }
  else {
    iVar3 = pdVar4->m_decode_start_code_size - 0x41;
    do {
      iVar8 = iVar3;
      iVar3 = iVar8 + 1;
    } while (pdVar4->m_max_codes[iVar8 + 0x40U] <= uVar7);
    lVar6 = (long)(int)(uVar5 >> (-(char)(iVar8 + 1) & 0x3fU)) +
            (long)pdVar4->m_val_ptrs[iVar8 + 0x40U];
    if ((model->super_raw_quasi_adaptive_huffman_data_model).m_total_syms <= (uint)lVar6) {
      return 0;
    }
    uVar9 = (uint)pdVar4->m_sorted_symbol_order[lVar6];
    uVar7 = iVar8 + 0x41;
  }
  this->m_bit_buf = uVar5 << ((byte)uVar7 & 0x3f);
  this->m_bit_count = iVar10 - uVar7;
  puVar2 = (model->super_raw_quasi_adaptive_huffman_data_model).m_sym_freq.m_p + uVar9;
  *puVar2 = *puVar2 + 1;
  puVar1 = &(model->super_raw_quasi_adaptive_huffman_data_model).m_symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    this->m_total_model_updates = this->m_total_model_updates + 1;
    raw_quasi_adaptive_huffman_data_model::update
              (&model->super_raw_quasi_adaptive_huffman_data_model);
  }
  return uVar9;
}

Assistant:

uint symbol_codec::decode(quasi_adaptive_huffman_data_model& model)
   {
      LZHAM_ASSERT(m_mode == cDecoding);
      LZHAM_ASSERT(!model.m_encoding);

      const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

      while (m_bit_count < (cBitBufSize - 8))
      {
         uint c = 0;
         if (m_pDecode_buf_next == m_pDecode_buf_end)
         {
            if (!m_decode_buf_eof)
            {
               m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
               m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
               m_pDecode_buf_next = m_pDecode_buf;
               if (m_pDecode_buf_next < m_pDecode_buf_end) c = *m_pDecode_buf_next++;
            }
         }
         else
            c = *m_pDecode_buf_next++;

         m_bit_count += 8;
         m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
      }

      uint k = static_cast<uint>((m_bit_buf >> (cBitBufSize - 16)) + 1);
      uint sym, len;

      if (k <= pTables->m_table_max_code)
      {
         uint32 t = pTables->m_lookup[m_bit_buf >> (cBitBufSize - pTables->m_table_bits)];

         LZHAM_ASSERT(t != UINT32_MAX);
         sym = t & UINT16_MAX;
         len = t >> 16;

         LZHAM_ASSERT(model.m_code_sizes[sym] == len);
      }
      else
      {
         len = pTables->m_decode_start_code_size;

         for ( ; ; )
         {
            if (k <= pTables->m_max_codes[len - 1])
               break;
            len++;
         }

         int val_ptr = pTables->m_val_ptrs[len - 1] + static_cast<int>((m_bit_buf >> (cBitBufSize - len)));

         if (((uint)val_ptr >= model.m_total_syms))
         {
            // corrupted stream, or a bug
            LZHAM_ASSERT(0);
            return 0;
         }

         sym = pTables->m_sorted_symbol_order[val_ptr];
      }

      m_bit_buf <<= len;
      m_bit_count -= len;

      uint freq = model.m_sym_freq[sym];
      freq++;
      model.m_sym_freq[sym] = static_cast<uint16>(freq);
      
      LZHAM_ASSERT(freq <= UINT16_MAX);
      
      if (--model.m_symbols_until_update == 0)
      {
         m_total_model_updates++;
         model.update();
      }

      return sym;
   }